

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TuningsImpl.h
# Opt level: O0

istream * Tunings::getlineEndingIndependent(istream *is,string *t)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  int c;
  streambuf *sb;
  string *psStack_20;
  sentry se;
  string *t_local;
  istream *is_local;
  
  psStack_20 = t;
  std::__cxx11::string::clear();
  std::istream::sentry::sentry((sentry *)((long)&sb + 7),is,true);
  bVar1 = std::istream::sentry::operator_cast_to_bool((sentry *)((long)&sb + 7));
  if (bVar1) {
    std::ios::rdbuf();
    while (iVar2 = std::streambuf::sbumpc(), iVar2 != -1) {
      if (iVar2 == 10) {
        return is;
      }
      if (iVar2 == 0xd) {
        iVar2 = std::streambuf::sgetc();
        if (iVar2 != 10) {
          return is;
        }
        std::streambuf::sbumpc();
        return is;
      }
      std::__cxx11::string::operator+=((string *)psStack_20,(char)iVar2);
    }
    std::ios::setstate((int)is + (int)*(undefined8 *)(*(long *)is + -0x18));
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      std::ios::setstate((int)is + (int)*(undefined8 *)(*(long *)is + -0x18));
    }
  }
  return is;
}

Assistant:

inline std::istream &getlineEndingIndependent(std::istream &is, std::string &t)
{
    t.clear();

    std::istream::sentry se(is, true);
    if (!se)
        return is;

    std::streambuf *sb = is.rdbuf();

    for (;;)
    {
        int c = sb->sbumpc();
        switch (c)
        {
        case '\n':
            return is;
        case '\r':
            if (sb->sgetc() == '\n')
            {
                sb->sbumpc();
            }
            return is;
        case EOF:
            is.setstate(std::ios::eofbit);
            if (t.empty())
            {
                is.setstate(std::ios::badbit);
            }
            return is;
        default:
            t += (char)c;
        }
    }
}